

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

void __thiscall
Kernel::Clause::collectVars2<Kernel::UnstableVarIt>
          (Clause *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *acc)

{
  TermList TVar1;
  bool bVar2;
  Literal **ppLVar3;
  uint uVar4;
  uint uVar5;
  UnstableVarIt vit;
  UnstableVarIt local_80;
  
  uVar4 = *(uint *)&this->field_0x38 & 0xfffff;
  if (uVar4 != 0) {
    ppLVar3 = this->_literals;
    uVar5 = 1;
    do {
      UnstableVarIt::UnstableVarIt(&local_80,&(*ppLVar3)->super_Term);
      while( true ) {
        bVar2 = UnstableVarIt::hasNext(&local_80);
        TVar1._content = local_80._next._content;
        if (!bVar2) break;
        local_80._next._content = 2;
        Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  (&acc->_map,TVar1._content >> 2);
      }
      UnstableVarIt::~UnstableVarIt(&local_80);
      ppLVar3 = this->_literals + (int)uVar5;
      bVar2 = uVar5 < uVar4;
      uVar5 = (uVar5 < uVar4) + uVar5;
    } while (bVar2);
  }
  return;
}

Assistant:

void Clause::collectVars2(DHSet<unsigned>& acc)
{
  for (Literal* lit : iterLits()) {
    VarIt vit(lit);
    while (vit.hasNext()) {
      TermList var = vit.next();
      ASS(var.isOrdinaryVar());
      acc.insert(var.var());
    }
  }
}